

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

bool __thiscall
glslang::TIoMapper::addStage
          (TIoMapper *this,EShLanguage stage,TIntermediate *intermediate,TInfoSink *infoSink,
          TIoMapResolver *resolver)

{
  size_t *psVar1;
  pointer *ppTVar2;
  value_type pTVar3;
  __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
  __last;
  __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
  __first;
  bool bVar4;
  uint uVar5;
  int iVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  TIntermNode *pTVar7;
  char *__s;
  reference ppTVar8;
  iterator iVar9;
  iterator iVar10;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  *entKey;
  long lVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  byte bVar14;
  TNotifyInOutAdaptor __f;
  TNotifyInOutAdaptor __f_00;
  TNotifyUniformAdaptor __f_01;
  TResolverUniformAdaptor in_stack_fffffffffffff438;
  bool local_b23;
  byte local_b22;
  bool local_b21;
  undefined1 local_b20 [8];
  TVarSetTraverser iter_iomap;
  TResolverUniformAdaptor local_a18;
  undefined8 local_988 [18];
  __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
  local_8f8;
  __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
  local_8f0;
  TVarLiveMap *local_8e8;
  size_t *local_8e0;
  TVarLivePair *local_8d8;
  __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
  local_8d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  *local_8c8;
  TVarLivePair *var_4;
  iterator __end1_4;
  iterator __begin1_4;
  TVarLiveVector *__range1_4;
  TVarLivePair *var_3;
  iterator __end1_3;
  iterator __begin1_3;
  TVarLiveVector *__range1_3;
  undefined1 local_7d8 [8];
  TResolverInOutAdaptor inOutResolve;
  TResolverUniformAdaptor uniformResolve;
  TNotifyUniformAdaptor uniformNotify;
  TNotifyInOutAdaptor inOutNotify;
  TVarLiveMap *dummyUniformVarMap [14];
  bool hadError;
  TVarLivePair local_680;
  reference local_628;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  *var_2;
  iterator __end1_2;
  iterator __begin1_2;
  TVarLiveMap *__range1_2;
  TVarLivePair local_5f0;
  reference local_598;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  *var_1;
  iterator __end1_1;
  iterator __begin1_1;
  TVarLiveMap *__range1_1;
  TVarLivePair local_560;
  reference local_508;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  *var;
  iterator __end1;
  iterator __begin1;
  TVarLiveMap *__range1;
  TIntermNode *destination;
  TString local_4d8;
  undefined1 local_4b0 [8];
  TVarGatherTraverser iter_binding_live;
  TVarGatherTraverser iter_binding_all;
  TVarLiveVector uniformVector;
  TVarLiveVector outVector;
  TVarLiveVector inVector;
  TVarLiveMap uniformVarMap;
  TVarLiveMap outVarMap;
  TVarLiveMap inVarMap;
  TDefaultHlslIoResolver defaultHlslResolver;
  TDefaultIoResolver defaultResolver;
  TIntermNode *root;
  int res;
  bool somethingToDo;
  TIoMapResolver *resolver_local;
  TInfoSink *infoSink_local;
  TIntermediate *intermediate_local;
  EShLanguage stage_local;
  TIoMapper *this_local;
  
  bVar14 = 0;
  this_00 = TIntermediate::getResourceSetBinding_abi_cxx11_(intermediate);
  bVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(this_00);
  local_b21 = true;
  if (bVar4) {
    bVar4 = TIntermediate::getAutoMapBindings(intermediate);
    local_b21 = true;
    if (!bVar4) {
      local_b21 = TIntermediate::getAutoMapLocations(intermediate);
    }
  }
  root._7_1_ = local_b21;
  root._0_4_ = EResSampler;
  while( true ) {
    local_b22 = 0;
    if ((int)(TResourceType)root < 6) {
      local_b22 = root._7_1_ ^ 0xff;
    }
    if ((local_b22 & 1) == 0) break;
    local_b23 = true;
    if (root._7_1_ == false) {
      uVar5 = TIntermediate::getShiftBinding(intermediate,(TResourceType)root);
      local_b23 = true;
      if (uVar5 == 0) {
        local_b23 = TIntermediate::hasShiftBindingForSet(intermediate,(TResourceType)root);
      }
    }
    root._7_1_ = local_b23;
    root._0_4_ = (TResourceType)root + EResTexture;
  }
  if ((root._7_1_ == false) && (resolver == (TIoMapResolver *)0x0)) {
    this_local._7_1_ = true;
  }
  else {
    iVar6 = TIntermediate::getNumEntryPoints(intermediate);
    if ((iVar6 != 1) || (bVar4 = TIntermediate::isRecursive(intermediate), bVar4)) {
      this_local._7_1_ = false;
    }
    else {
      pTVar7 = TIntermediate::getTreeRoot(intermediate);
      if (pTVar7 == (TIntermNode *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        TDefaultIoResolver::TDefaultIoResolver
                  ((TDefaultIoResolver *)
                   (defaultHlslResolver.super_TDefaultIoResolverBase.stageIntermediates + 0xd),
                   intermediate);
        TDefaultHlslIoResolver::TDefaultHlslIoResolver
                  ((TDefaultHlslIoResolver *)
                   &inVarMap._M_t._M_impl.super__Rb_tree_header._M_node_count,intermediate);
        _res = (TIntermediate **)resolver;
        if (resolver == (TIoMapResolver *)0x0) {
          bVar4 = TIntermediate::usingHlslIoMapping(intermediate);
          if (bVar4) {
            _res = (TIntermediate **)&inVarMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
          }
          else {
            _res = defaultHlslResolver.super_TDefaultIoResolverBase.stageIntermediates + 0xd;
          }
        }
        (*(code *)((*_res)->requestedExtensions)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left)(_res,stage,intermediate);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
               *)&outVarMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
               *)&uniformVarMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
               *)&inVector.
                  super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::vector
                  ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                   &outVector.
                    super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::vector
                  ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                   &uniformVector.
                    super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::vector
                  ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                   &iter_binding_all.uniformList);
        TVarGatherTraverser::TVarGatherTraverser
                  ((TVarGatherTraverser *)&iter_binding_live.uniformList,intermediate,true,
                   (TVarLiveMap *)&outVarMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (TVarLiveMap *)&uniformVarMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (TVarLiveMap *)
                   &inVector.
                    super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        TVarGatherTraverser::TVarGatherTraverser
                  ((TVarGatherTraverser *)local_4b0,intermediate,false,
                   (TVarLiveMap *)&outVarMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (TVarLiveMap *)&uniformVarMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (TVarLiveMap *)
                   &inVector.
                    super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        (*pTVar7->_vptr_TIntermNode[2])(pTVar7,&iter_binding_live.uniformList);
        TIntermediate::getEntryPointMangledName_abi_cxx11_(intermediate);
        __s = (char *)std::__cxx11::string::c_str();
        pool_allocator<char>::pool_allocator((pool_allocator<char> *)&destination);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_4d8,__s,(pool_allocator<char> *)&destination);
        TLiveTraverser::pushFunction((TLiveTraverser *)local_4b0,&local_4d8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_4d8);
        while (bVar4 = std::__cxx11::
                       list<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                       ::empty((list<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                                *)&iter_binding_live.super_TLiveTraverser.super_TIntermTraverser.
                                   path.
                                   super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                   .
                                   super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage),
              ((bVar4 ^ 0xffU) & 1) != 0) {
          ppTVar8 = std::__cxx11::
                    list<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                    ::back((list<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                            *)&iter_binding_live.super_TLiveTraverser.super_TIntermTraverser.path.
                               super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                               super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pTVar3 = *ppTVar8;
          std::__cxx11::
          list<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>::pop_back
                    ((list<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                      *)&iter_binding_live.super_TLiveTraverser.super_TIntermTraverser.path.
                         super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                         super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
          (*(pTVar3->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [2])(pTVar3,local_4b0);
        }
        psVar1 = &outVarMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
        __end1 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                 ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                          *)psVar1);
        var = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                        *)psVar1);
        while (bVar4 = std::operator!=(&__end1,(_Self *)&var), bVar4) {
          local_508 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                      ::operator*(&__end1);
          TVarLivePair::TVarLivePair(&local_560,local_508);
          std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::push_back
                    ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                     &outVector.
                      super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_560);
          TVarLivePair::~TVarLivePair(&local_560);
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
          ::operator++(&__end1);
        }
        iVar9 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           &outVector.
                            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar10 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                           ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *
                            )&outVector.
                              super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__0>
                  (iVar9._M_current,iVar10._M_current);
        psVar1 = &uniformVarMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
        __end1_1 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                   ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                            *)psVar1);
        var_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                 *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                   ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                          *)psVar1);
        while (bVar4 = std::operator!=(&__end1_1,(_Self *)&var_1), bVar4) {
          local_598 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                      ::operator*(&__end1_1);
          TVarLivePair::TVarLivePair(&local_5f0,local_598);
          std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::push_back
                    ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                     &uniformVector.
                      super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_5f0);
          TVarLivePair::~TVarLivePair(&local_5f0);
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
          ::operator++(&__end1_1);
        }
        iVar9 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           &uniformVector.
                            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar10 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                           ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *
                            )&uniformVector.
                              super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__1>
                  (iVar9._M_current,iVar10._M_current);
        ppTVar2 = &inVector.
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __end1_2 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                   ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                            *)ppTVar2);
        var_2 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                 *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                   ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                          *)ppTVar2);
        while (bVar4 = std::operator!=(&__end1_2,(_Self *)&var_2), bVar4) {
          local_628 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                      ::operator*(&__end1_2);
          TVarLivePair::TVarLivePair(&local_680,local_628);
          std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::push_back
                    ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                     &iter_binding_all.uniformList,&local_680);
          TVarLivePair::~TVarLivePair(&local_680);
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
          ::operator++(&__end1_2);
        }
        iVar9 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           &iter_binding_all.uniformList);
        std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                  ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                   &iter_binding_all.uniformList);
        std::
        sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__2>
                  (iVar9._M_current);
        dummyUniformVarMap[0xd]._6_1_ = 0;
        memset(&inOutNotify.resolver,0,0x70);
        TNotifyInOutAdaptor::TNotifyInOutAdaptor
                  ((TNotifyInOutAdaptor *)&uniformNotify.resolver,stage,(TIoMapResolver *)_res);
        TNotifyUniformAdaptor::TNotifyUniformAdaptor
                  ((TNotifyUniformAdaptor *)(uniformResolve.uniformVarMap + 0xd),stage,
                   (TIoMapResolver *)_res);
        TResolverUniformAdaptor::TResolverUniformAdaptor
                  ((TResolverUniformAdaptor *)&inOutResolve.error,stage,(TIoMapResolver *)_res,
                   (TVarLiveMap **)&inOutNotify.resolver,infoSink,
                   (bool *)((long)dummyUniformVarMap + 0x6e));
        TResolverInOutAdaptor::TResolverInOutAdaptor
                  ((TResolverInOutAdaptor *)local_7d8,stage,(TIoMapResolver *)_res,infoSink,
                   (bool *)((long)dummyUniformVarMap + 0x6e));
        (**(code **)&(*_res)->profile)(_res,stage);
        iVar9 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           &outVector.
                            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar10 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                           ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *
                            )&outVector.
                              super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __f._0_8_ = (ulong)uniformNotify.resolver & 0xffffffff;
        __f.resolver = (TIoMapResolver *)inOutNotify._0_8_;
        std::
        for_each<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,glslang::TNotifyInOutAdaptor>
                  ((__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                    )iVar9._M_current,
                   (__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                    )iVar10._M_current,__f);
        iVar9 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           &uniformVector.
                            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar10 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                           ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *
                            )&uniformVector.
                              super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __f_00._0_8_ = (ulong)uniformNotify.resolver & 0xffffffff;
        __f_00.resolver = (TIoMapResolver *)inOutNotify._0_8_;
        std::
        for_each<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,glslang::TNotifyInOutAdaptor>
                  ((__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                    )iVar9._M_current,
                   (__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                    )iVar10._M_current,__f_00);
        iVar9 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           &iter_binding_all.uniformList);
        iVar10 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                           ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *
                            )&iter_binding_all.uniformList);
        __f_01._0_8_ = (ulong)uniformResolve.uniformVarMap[0xd] & 0xffffffff;
        __f_01.resolver = (TIoMapResolver *)uniformNotify._0_8_;
        std::
        for_each<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,glslang::TNotifyUniformAdaptor>
                  ((__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                    )iVar9._M_current,
                   (__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                    )iVar10._M_current,__f_01);
        (**(code **)&(*_res)->spvVersion)(_res,stage);
        (**(code **)&((*_res)->spvVersion).vulkan)(_res,stage);
        ppTVar2 = &outVector.
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __end1_3 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                             ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                               *)ppTVar2);
        var_3 = (TVarLivePair *)
                std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           ppTVar2);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end1_3,
                                  (__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                                   *)&var_3), bVar4) {
          entKey = &__gnu_cxx::
                    __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                    ::operator*(&__end1_3)->
                    super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ;
          TResolverInOutAdaptor::operator()((TResolverInOutAdaptor *)local_7d8,entKey);
          __gnu_cxx::
          __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
          ::operator++(&__end1_3);
        }
        iVar9 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           &outVector.
                            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar10 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                           ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *
                            )&outVector.
                              super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        for_each<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__3>
                  ((__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                    )iVar9._M_current,
                   (__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                    )iVar10._M_current,
                   (anon_class_8_1_d681afb8)
                   &outVarMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
        ppTVar2 = &uniformVector.
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __end1_4 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                             ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                               *)ppTVar2);
        var_4 = (TVarLivePair *)
                std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           ppTVar2);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end1_4,
                                  (__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                                   *)&var_4), bVar4) {
          local_8c8 = &__gnu_cxx::
                       __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                       ::operator*(&__end1_4)->
                       super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ;
          TResolverInOutAdaptor::operator()((TResolverInOutAdaptor *)local_7d8,local_8c8);
          __gnu_cxx::
          __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
          ::operator++(&__end1_4);
        }
        local_8d0._M_current =
             (TVarLivePair *)
             std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                       ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                        &uniformVector.
                         super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_8d8 = (TVarLivePair *)
                    std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                              ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                                *)&uniformVector.
                                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_8e0 = &uniformVarMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
        local_8e8 = (TVarLiveMap *)
                    std::
                    for_each<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__4>
                              (local_8d0,
                               (__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                                )local_8d8,(anon_class_8_1_69cdb043)local_8e0);
        local_8f0._M_current =
             (TVarLivePair *)
             std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                       ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                        &iter_binding_all.uniformList);
        local_8f8._M_current =
             (TVarLivePair *)
             std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                       ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                        &iter_binding_all.uniformList);
        memcpy(local_988,&inOutResolve.error,0x90);
        __first._M_current = local_8f0._M_current;
        __last._M_current = local_8f8._M_current;
        puVar12 = local_988;
        puVar13 = (undefined8 *)&stack0xfffffffffffff438;
        for (lVar11 = 0x12; lVar11 != 0; lVar11 = lVar11 + -1) {
          *puVar13 = *puVar12;
          puVar12 = puVar12 + (ulong)bVar14 * -2 + 1;
          puVar13 = puVar13 + (ulong)bVar14 * -2 + 1;
        }
        std::
        for_each<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,glslang::TResolverUniformAdaptor>
                  (&local_a18,__first,__last,in_stack_fffffffffffff438);
        iVar9 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::begin
                          ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                           &iter_binding_all.uniformList);
        iVar10 = std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::end
                           ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *
                            )&iter_binding_all.uniformList);
        iter_iomap.uniformList =
             (TVarLiveMap *)
             std::
             for_each<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__5>
                       ((__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                         )iVar9._M_current,
                        (__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                         )iVar10._M_current,
                        (anon_class_8_1_528ccda9)
                        &inVector.
                         super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        (**(code **)&((*_res)->spvVersion).vulkanRelaxed)(_res,stage);
        if ((dummyUniformVarMap[0xd]._6_1_ & 1) == 0) {
          TVarSetTraverser::TVarSetTraverser
                    ((TVarSetTraverser *)local_b20,intermediate,
                     (TVarLiveMap *)&outVarMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (TVarLiveMap *)&uniformVarMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (TVarLiveMap *)
                     &inVector.
                      super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          (*pTVar7->_vptr_TIntermNode[2])(pTVar7,local_b20);
          TVarSetTraverser::~TVarSetTraverser((TVarSetTraverser *)local_b20);
        }
        this_local._7_1_ = (bool)((dummyUniformVarMap[0xd]._6_1_ ^ 0xff) & 1);
        TVarGatherTraverser::~TVarGatherTraverser((TVarGatherTraverser *)local_4b0);
        TVarGatherTraverser::~TVarGatherTraverser
                  ((TVarGatherTraverser *)&iter_binding_live.uniformList);
        std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::~vector
                  ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                   &iter_binding_all.uniformList);
        std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::~vector
                  ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                   &uniformVector.
                    super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::~vector
                  ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                   &outVector.
                    super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                *)&inVector.
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                *)&uniformVarMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                *)&outVarMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
        TDefaultHlslIoResolver::~TDefaultHlslIoResolver
                  ((TDefaultHlslIoResolver *)
                   &inVarMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
        TDefaultIoResolver::~TDefaultIoResolver
                  ((TDefaultIoResolver *)
                   (defaultHlslResolver.super_TDefaultIoResolverBase.stageIntermediates + 0xd));
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool TIoMapper::addStage(EShLanguage stage, TIntermediate& intermediate, TInfoSink& infoSink, TIoMapResolver* resolver) {
    bool somethingToDo = ! intermediate.getResourceSetBinding().empty() || intermediate.getAutoMapBindings() ||
                         intermediate.getAutoMapLocations();
    // Restrict the stricter condition to further check 'somethingToDo' only if 'somethingToDo' has not been set, reduce
    // unnecessary or insignificant for-loop operation after 'somethingToDo' have been true.
    for (int res = 0; (res < EResCount && !somethingToDo); ++res) {
        somethingToDo = somethingToDo || (intermediate.getShiftBinding(TResourceType(res)) != 0) ||
                        intermediate.hasShiftBindingForSet(TResourceType(res));
    }
    if (! somethingToDo && resolver == nullptr)
        return true;
    if (intermediate.getNumEntryPoints() != 1 || intermediate.isRecursive())
        return false;
    TIntermNode* root = intermediate.getTreeRoot();
    if (root == nullptr)
        return false;
    // if no resolver is provided, use the default resolver with the given shifts and auto map settings
    TDefaultIoResolver defaultResolver(intermediate);
#ifdef ENABLE_HLSL
    TDefaultHlslIoResolver defaultHlslResolver(intermediate);
    if (resolver == nullptr) {
        // TODO: use a passed in IO mapper for this
        if (intermediate.usingHlslIoMapping())
            resolver = &defaultHlslResolver;
        else
            resolver = &defaultResolver;
    }
#else
    resolver = &defaultResolver;
#endif
    resolver->addStage(stage, intermediate);

    TVarLiveMap inVarMap, outVarMap, uniformVarMap;
    TVarLiveVector inVector, outVector, uniformVector;
    TVarGatherTraverser iter_binding_all(intermediate, true, inVarMap, outVarMap, uniformVarMap);
    TVarGatherTraverser iter_binding_live(intermediate, false, inVarMap, outVarMap, uniformVarMap);
    root->traverse(&iter_binding_all);
    iter_binding_live.pushFunction(intermediate.getEntryPointMangledName().c_str());
    while (! iter_binding_live.destinations.empty()) {
        TIntermNode* destination = iter_binding_live.destinations.back();
        iter_binding_live.destinations.pop_back();
        destination->traverse(&iter_binding_live);
    }

    // sort entries by priority. see TVarEntryInfo::TOrderByPriority for info.
    for (auto& var : inVarMap) { inVector.push_back(var); }
    std::sort(inVector.begin(), inVector.end(), [](const TVarLivePair& p1, const TVarLivePair& p2) -> bool {
        return TVarEntryInfo::TOrderByPriority()(p1.second, p2.second);
    });
    for (auto& var : outVarMap) { outVector.push_back(var); }
    std::sort(outVector.begin(), outVector.end(), [](const TVarLivePair& p1, const TVarLivePair& p2) -> bool {
        return TVarEntryInfo::TOrderByPriority()(p1.second, p2.second);
    });
    for (auto& var : uniformVarMap) { uniformVector.push_back(var); }
    std::sort(uniformVector.begin(), uniformVector.end(), [](const TVarLivePair& p1, const TVarLivePair& p2) -> bool {
        return TVarEntryInfo::TOrderByPriority()(p1.second, p2.second);
    });
    bool hadError = false;
    TVarLiveMap* dummyUniformVarMap[EShLangCount] = {};
    TNotifyInOutAdaptor inOutNotify(stage, *resolver);
    TNotifyUniformAdaptor uniformNotify(stage, *resolver);
    TResolverUniformAdaptor uniformResolve(stage, *resolver, dummyUniformVarMap, infoSink, hadError);
    TResolverInOutAdaptor inOutResolve(stage, *resolver, infoSink, hadError);
    resolver->beginNotifications(stage);
    std::for_each(inVector.begin(), inVector.end(), inOutNotify);
    std::for_each(outVector.begin(), outVector.end(), inOutNotify);
    std::for_each(uniformVector.begin(), uniformVector.end(), uniformNotify);
    resolver->endNotifications(stage);
    resolver->beginResolve(stage);
    for (auto& var : inVector) { inOutResolve(var); }
    std::for_each(inVector.begin(), inVector.end(), [&inVarMap](TVarLivePair p) {
        auto at = inVarMap.find(p.second.symbol->getAccessName());
        if (at != inVarMap.end() && p.second.id == at->second.id)
            at->second = p.second;
    });
    for (auto& var : outVector) { inOutResolve(var); }
    std::for_each(outVector.begin(), outVector.end(), [&outVarMap](TVarLivePair p) {
        auto at = outVarMap.find(p.second.symbol->getAccessName());
        if (at != outVarMap.end() && p.second.id == at->second.id)
            at->second = p.second;
    });
    std::for_each(uniformVector.begin(), uniformVector.end(), uniformResolve);
    std::for_each(uniformVector.begin(), uniformVector.end(), [&uniformVarMap](TVarLivePair p) {
        auto at = uniformVarMap.find(p.second.symbol->getAccessName());
        if (at != uniformVarMap.end() && p.second.id == at->second.id)
            at->second = p.second;
    });
    resolver->endResolve(stage);
    if (!hadError) {
        TVarSetTraverser iter_iomap(intermediate, inVarMap, outVarMap, uniformVarMap);
        root->traverse(&iter_iomap);
    }
    return !hadError;
}